

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  value *this;
  long lVar1;
  char cVar2;
  bool bVar3;
  content<mpt::item<mpt::layout::graph>_> *d;
  long *plVar4;
  char *pcVar5;
  ostream *poVar6;
  ulong uVar7;
  int iVar8;
  object *__range2;
  color local_124;
  long *local_120;
  point<float> local_118;
  char **local_110;
  long *local_108;
  span<const_float> local_100;
  const_iterator __begin2;
  layout lay;
  long local_90;
  const_iterator __end2;
  
  mtrace();
  mpt::layout::layout(&lay);
  if (argc < 2) {
    mpt::warning("main","%s","missing layout argument");
    iVar8 = 1;
  }
  else {
    cVar2 = mpt::layout::open((char *)&lay);
    if (cVar2 == '\0') {
      mpt::error("main","%s: %s","unable to open layout",argv[1]);
      iVar8 = 2;
    }
    else {
      mpt::logger::default_instance();
      cVar2 = mpt::layout::load((logger *)&lay);
      if (cVar2 == '\0') {
        mpt::error("main","%s: %s","unable to load layout",argv[1]);
        iVar8 = 3;
      }
      else {
        if (local_90 == 0) {
          plVar4 = (long *)0x0;
          uVar7 = 0;
        }
        else {
          plVar4 = (long *)(local_90 + 0x20);
          uVar7 = *(ulong *)(local_90 + 0x18) >> 5;
        }
        local_108 = plVar4 + uVar7 * 4;
        this = &__begin2._prop.val;
        local_110 = argv;
        while (plVar4 != local_108) {
          local_120 = plVar4;
          pcVar5 = (char *)mpt::identifier::name();
          poVar6 = std::operator<<((ostream *)&std::cout,pcVar5);
          poVar6 = std::operator<<(poVar6," {");
          std::endl<char,std::char_traits<char>>(poVar6);
          lVar1 = *local_120;
          mpt::object::const_begin(&__begin2,(object *)(lVar1 + 0x18));
          mpt::object::const_iterator::const_iterator(&__end2,(object *)(lVar1 + 0x18));
          while ((__begin2._ref != __end2._ref || (__begin2._pos != __end2._pos))) {
            local_124.alpha = 0xff;
            local_124.red = '\0';
            local_124.green = '\0';
            local_124.blue = '\0';
            bVar3 = mpt::value::get<mpt::color>(this,&local_124);
            if (bVar3) {
              poVar6 = std::operator<<((ostream *)&std::cout,"  ");
              poVar6 = std::operator<<(poVar6,__begin2._prop.name);
              poVar6 = std::operator<<(poVar6," = ");
              poVar6 = (ostream *)operator<<(poVar6,&local_124);
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            else {
              local_118.x = 0.0;
              local_118.y = 0.0;
              bVar3 = mpt::value::get<mpt::fpoint>(this,(fpoint *)&local_118);
              if (bVar3) {
                poVar6 = std::operator<<((ostream *)&std::cout,"  ");
                poVar6 = std::operator<<(poVar6,__begin2._prop.name);
                poVar6 = std::operator<<(poVar6," = [");
                local_100._base = &local_118.x;
                local_100._len = 8;
                poVar6 = operator<<(poVar6,&local_100);
                poVar6 = std::operator<<(poVar6,']');
                std::endl<char,std::char_traits<char>>(poVar6);
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cout,"  ");
                poVar6 = std::operator<<(poVar6,__begin2._prop.name);
                poVar6 = std::operator<<(poVar6," = ");
                poVar6 = (ostream *)operator<<(poVar6,this);
                std::endl<char,std::char_traits<char>>(poVar6);
              }
            }
            mpt::object::const_iterator::operator++(&__begin2);
          }
          poVar6 = std::operator<<((ostream *)&std::cout,"}");
          std::endl<char,std::char_traits<char>>(poVar6);
          plVar4 = local_120 + 4;
        }
        cVar2 = mpt::layout::reset();
        iVar8 = 0;
        if (cVar2 == '\0') {
          mpt::error("main","%s: %s","unable to reset layout parser",local_110[1]);
          iVar8 = 4;
        }
      }
    }
  }
  mpt::layout::~layout(&lay);
  return iVar8;
}

Assistant:

extern int main(int argc, char *argv[])
{
	mtrace();
	
	mpt::layout lay;
	
	if (argc < 2) {
		mpt::warning(__func__, "%s", "missing layout argument");
		return 1;
	}
	if (!lay.open(argv[1])) {
		mpt::error(__func__, "%s: %s", "unable to open layout", argv[1]);
		return 2;
	}
	if (!lay.load()) {
		mpt::error(__func__, "%s: %s", "unable to load layout", argv[1]);
		return 3;
	}
	for (const mpt::item<mpt::layout::graph> &g : lay.graphs()) {
		std::cout << g.name() << " {" << std::endl;
		const mpt::object &o = *g.instance();
		for (const mpt::property &p : o) {
			mpt::color col;
			if (p.val.get(col)) {
				std::cout << "  " << p.name << " = " << col << std::endl;
				continue;
			}
			mpt::fpoint fp;
			if (p.val.get(fp)) {
				std::cout << "  " << p.name << " = [" << fp.span() << ']' << std::endl;
				continue;
			}
			std::cout << "  " << p.name << " = " << p.val << std::endl;
		}
		std::cout << "}" << std::endl;
	}
	if (!lay.reset()) {
		mpt::error(__func__, "%s: %s", "unable to reset layout parser", argv[1]);
		return 4;
	}
}